

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O2

void __thiscall
ear::PolarExtent::setup_weighting_function
          (PolarExtent *this,Vector3d *position,double width,double height)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar4;
  Scalar *pSVar5;
  size_t j;
  long col;
  extent_float_t *peVar6;
  size_t i;
  long row;
  double local_148;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_138;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Matrix3d flip;
  Vector3d local_88;
  Matrix3d m;
  
  dVar2 = height * 0.017453292519943295 * 0.5;
  dVar3 = width * 0.017453292519943295 * 0.5;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  calcBasis(&m,&local_88);
  local_148 = dVar2;
  if (auVar1._8_8_ < dVar2) {
    local_138.m_row = 0;
    local_138.m_col = 1;
    local_138.m_currentBlockRows = 1;
    flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         0.0;
    local_e0 = 0.0;
    local_138.m_xpr = &flip;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (&local_138,&local_e0);
    local_e8 = 1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar4,&local_e8);
    local_f0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar4,&local_f0);
    local_f8 = 1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar4,&local_f8);
    local_100 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar4,&local_100);
    local_108 = -1.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar4,&local_108);
    local_110 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar4,&local_110);
    local_118 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&local_118);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_138);
    local_138.m_xpr = &flip;
    local_138.m_row = (Index)&m;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              (&m,(Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
                   *)&local_138);
    local_148 = auVar1._8_8_;
    dVar3 = dVar2;
  }
  peVar6 = (this->ctx).flippedBasis;
  for (row = 0; row != 3; row = row + 1) {
    for (col = 0; col != 3; col = col + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)&m,row,col);
      peVar6[col] = (float)*pSVar5;
    }
    peVar6 = peVar6 + 3;
  }
  local_138.m_col = (Index)(local_148 + 3.141592653589793);
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_
       = 0x54442d18;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._4_4_
       = 0x3ff921fb;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       3.141592653589793;
  local_138.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  local_138.m_row = 0x3ff921fb54442d18;
  local_138.m_xpr =
       (Matrix<double,_3,_3,_0,_3,_3> *)
       interp<3,_3>(dVar3,(Matrix<double,_3,_1,_0,_3,_1> *)&flip,
                    (Matrix<double,_3,_1,_0,_3,_1> *)&local_138);
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_
       = 0x54442d18;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._4_4_
       = 0x3fe921fb;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       1.5707963267948966;
  flip.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       3.141592653589793;
  local_138.m_row = (Index)local_138.m_xpr;
  local_138.m_col = (Index)dVar3;
  local_138.m_currentBlockRows = (Index)dVar3;
  dVar2 = interp<4,_4>(local_148,(Matrix<double,_4,_1,_0,_4,_1> *)&flip,
                       (Matrix<double,_4,_1,_0,_4,_1> *)&local_138);
  dVar2 = dVar2 - local_148;
  (this->ctx).is_circular = dVar2 < 1e-06;
  dVar3 = sin(dVar2);
  (this->ctx).right_circle_centre[0] = (float)dVar3;
  dVar3 = cos(dVar2);
  (this->ctx).right_circle_centre[1] = (float)dVar3;
  dVar3 = cos(dVar2);
  (this->ctx).circle_test[0] = -(float)dVar3;
  dVar2 = sin(dVar2);
  (this->ctx).circle_test[1] = (float)dVar2;
  setup_angle_to_weight(this,local_148,local_148 + 0.17453292519943295);
  return;
}

Assistant:

Eigen::MatrixXd generatePanningPositionsEven(int nRows) {
      Eigen::VectorXd elevations =
          Eigen::VectorXd::LinSpaced(nRows, -90.0, 90.0);
      Eigen::MatrixXd positions(0, 3);

      for (double el : elevations) {
        double radius = cos(radians(el));
        double perimiter = 2 * PI * radius;
        double perimiter_centre = 2 * PI;

        int nPoints = static_cast<int>(
            std::round((perimiter / perimiter_centre) * 2 * (nRows - 1)));
        if (nPoints == 0) {
          nPoints = 1;
        }
        Eigen::VectorXd azimuths =
            Eigen::VectorXd::LinSpaced(nPoints + 1, 0.0, 360.0);
        for (int i = 0; i < azimuths.size() - 1; ++i) {
          double az = azimuths(i);
          positions.conservativeResize(positions.rows() + 1, Eigen::NoChange);
          positions.row(positions.rows() - 1) = cart(az, el, 1.0);
        }
      }
      return positions;
    }